

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node_struct * __thiscall pugi::xml_text::_data(xml_text *this)

{
  bool bVar1;
  long *in_RDI;
  xml_node_struct *node;
  xml_node_struct *local_18;
  
  if ((*in_RDI == 0) ||
     (bVar1 = impl::anon_unknown_0::is_text_node((xml_node_struct *)*in_RDI), bVar1)) {
    return (xml_node_struct *)*in_RDI;
  }
  if ((((uint)*(undefined8 *)*in_RDI & 0xf) == 2) && (*(long *)(*in_RDI + 0x10) != 0)) {
    return (xml_node_struct *)*in_RDI;
  }
  local_18 = *(xml_node_struct **)(*in_RDI + 0x20);
  while( true ) {
    if (local_18 == (xml_node_struct *)0x0) {
      return (xml_node_struct *)0x0;
    }
    bVar1 = impl::anon_unknown_0::is_text_node(local_18);
    if (bVar1) break;
    local_18 = local_18->next_sibling;
  }
  return local_18;
}

Assistant:

PUGI__FN xml_node_struct* xml_text::_data() const
	{
		if (!_root || impl::is_text_node(_root)) return _root;

		// element nodes can have value if parse_embed_pcdata was used
		if (PUGI__NODETYPE(_root) == node_element && _root->value)
			return _root;

		for (xml_node_struct* node = _root->first_child; node; node = node->next_sibling)
			if (impl::is_text_node(node))
				return node;

		return 0;
	}